

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_archive.hpp
# Opt level: O1

void __thiscall
pstore::serialize::archive::database_reader::get<pstore::uint128,void>
          (database_reader *this,uint128 *v)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  value_type vVar4;
  unique_pointer<const_pstore::uint128> result;
  _func_int **local_28;
  _Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false> local_20;
  
  vVar4 = (this->addr_).a_;
  vVar4 = (vVar4 + 0xf & 0xfffffffffffffff0) - vVar4;
  if (vVar4 < 0x10) {
    address::operator+=(&this->addr_,vVar4);
    database::getrou<pstore::uint128,void>
              ((database *)&stack0xffffffffffffffd8,(typed_address<pstore::uint128>)this->db_,
               (this->addr_).a_);
    address::operator+=(&this->addr_,0x10);
    uVar1 = *(undefined4 *)
             ((long)&(local_20._M_head_impl)->_M_elems[0].value.
                     super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4);
    uVar2 = *(undefined4 *)
             &(local_20._M_head_impl)->_M_elems[0].value.
              super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    uVar3 = *(undefined4 *)
             ((long)&(local_20._M_head_impl)->_M_elems[0].value.
                     super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 4);
    *(undefined4 *)&v->v_ =
         *(undefined4 *)
          &(local_20._M_head_impl)->_M_elems[0].value.
           super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    *(undefined4 *)((long)&v->v_ + 4) = uVar1;
    *(undefined4 *)((long)&v->v_ + 8) = uVar2;
    *(undefined4 *)((long)&v->v_ + 0xc) = uVar3;
    if ((_Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>)local_20._M_head_impl !=
        (_Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>)0x0) {
      (*(code *)local_28)();
    }
    return;
  }
  assert_failed("extra_for_alignment < sizeof (Ty)",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/db_archive.hpp"
                ,0x94);
}

Assistant:

void database_reader::get (Ty & v) {

                auto const extra_for_alignment = calc_alignment (addr_.absolute (), alignof (Ty));
                PSTORE_ASSERT (extra_for_alignment < sizeof (Ty));
                addr_ += extra_for_alignment;
                // Load the data.
                auto result = db_.getrou (typed_address<Ty> (addr_));
                addr_ += sizeof (Ty);
                // Copy to the destination.
                new (&v) Ty (*result);
            }